

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTuples.cpp
# Opt level: O0

int main(void)

{
  Severity SVar1;
  cx_string<2UL> cVar2;
  SessionWriter *pSVar3;
  data_ref pacVar4;
  Session *this;
  cx_string<10UL> cVar5;
  uint64_t _binlog_sid_v_1;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
  t;
  pair<int,_char> p;
  uint64_t _binlog_sid_v;
  tuple<> empty;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_3;
  memory_order __b_1;
  char (*in_stack_fffffffffffffbe8) [16];
  __atomic_base<unsigned_long> t_1;
  EventSource *in_stack_fffffffffffffbf0;
  char (*in_stack_fffffffffffffbf8) [16];
  atomic<unsigned_long> *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  Session *in_stack_fffffffffffffc10;
  EventSource *in_stack_fffffffffffffc18;
  EventSource *eventSource;
  Session *in_stack_fffffffffffffc20;
  undefined1 local_279 [29];
  allocator local_25c;
  allocator local_25b;
  allocator local_25a;
  allocator local_259;
  undefined8 local_258;
  undefined2 local_250;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  undefined8 local_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  __atomic_base<unsigned_long> local_1a0;
  undefined4 local_198;
  undefined1 local_191;
  char local_165;
  int local_164;
  pair<int,_char> local_160;
  undefined1 local_157;
  undefined1 local_156;
  undefined1 local_155;
  undefined1 local_154;
  allocator local_153;
  cx_string<2UL> local_152;
  allocator local_14f;
  allocator local_14e;
  allocator local_14d [20];
  allocator local_139;
  undefined8 local_138;
  undefined2 local_130;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  undefined8 local_c8;
  string local_c0 [32];
  string local_a0 [32];
  __atomic_base<unsigned_long> local_80;
  int local_74;
  __atomic_base<unsigned_long> local_70;
  memory_order local_68;
  undefined4 local_64;
  atomic<unsigned_long> *local_60;
  __atomic_base<unsigned_long> local_58;
  memory_order local_50;
  undefined4 local_4c;
  atomic<unsigned_long> *local_48;
  Session *local_40;
  memory_order local_38;
  int local_34;
  Session *local_30;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_74 = 0;
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar1 = binlog::Session::minSeverity((Session *)0x1024b7);
  if (SVar1 < 0x81) {
    local_48 = &main::_binlog_sid;
    local_4c = 0;
    local_50 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_58 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_80 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_138 = 0;
      local_130 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"main",&local_139);
      local_157 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"main",local_14d);
      local_156 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingTuples.cpp"
                 ,&local_14e);
      local_155 = 1;
      local_c8 = 0xc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"Empty tuple: {}",&local_14f);
      local_154 = 1;
      cVar2 = binlog::detail::concatenated_tags<char_const(&)[16],std::tuple<>&>
                        (in_stack_fffffffffffffbf8,(tuple<> *)in_stack_fffffffffffffbf0);
      local_152._data._0_2_ = cVar2._data._0_2_;
      local_152._data[2] = cVar2._data[2];
      pacVar4 = mserialize::cx_string<2UL>::data(&local_152);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,*pacVar4,&local_153);
      local_154 = 0;
      local_155 = 0;
      local_156 = 0;
      local_157 = 0;
      local_80._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      binlog::EventSource::~EventSource(in_stack_fffffffffffffbf0);
      std::allocator<char>::~allocator((allocator<char> *)&local_153);
      std::allocator<char>::~allocator((allocator<char> *)&local_14f);
      std::allocator<char>::~allocator((allocator<char> *)&local_14e);
      std::allocator<char>::~allocator((allocator<char> *)local_14d);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      local_8 = &main::_binlog_sid;
      local_10._M_i = local_80._M_i;
      local_14 = 5;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10._M_i;
      if ((local_14 != 3) && (local_14 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[16],std::tuple<>&>
              ((SessionWriter *)in_stack_fffffffffffffc00,(uint64_t)in_stack_fffffffffffffbf8,
               (uint64_t)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,(tuple<> *)0x102aaa);
  }
  local_164 = 1;
  local_165 = 'a';
  std::pair<int,_char>::pair<int,_char,_true>(&local_160,&local_164,&local_165);
  local_191 = 1;
  local_198 = 2;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
  ::tuple<const_char_(&)[4],_bool,_int,_true,_true>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
              *)in_stack_fffffffffffffc00,(char (*) [4])in_stack_fffffffffffffbf8,
             (bool *)in_stack_fffffffffffffbf0,(int *)in_stack_fffffffffffffbe8);
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar1 = binlog::Session::minSeverity((Session *)0x102b48);
  if (SVar1 < 0x81) {
    local_60 = &main::_binlog_sid;
    local_64 = 0;
    local_68 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_70 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_1a0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_258 = 0;
      local_250 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,"main",&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"main",&local_25a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingTuples.cpp"
                 ,&local_25b);
      local_1e8._0_7_ = 0x12;
      local_1e8._7_1_ = (string)0x0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e0,"Pair: {}, Tuple: {}",&local_25c);
      cVar5 = binlog::detail::
              concatenated_tags<char_const(&)[20],std::pair<int,char>&,std::tuple<std::__cxx11::string,bool,int>&>
                        ((char (*) [20])in_stack_fffffffffffffc20,
                         (pair<int,_char> *)in_stack_fffffffffffffc18,
                         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
                          *)in_stack_fffffffffffffc10);
      local_279._9_2_ = cVar5._data._8_2_;
      local_279[0xb] = cVar5._data[10];
      local_279._1_7_ = cVar5._data._0_7_;
      local_279[8] = cVar5._data[7];
      local_279._24_4_ = cVar5._data._7_4_;
      local_279._17_7_ = local_279._1_7_;
      this = (Session *)mserialize::cx_string<10UL>::data((cx_string<10UL> *)(local_279 + 0x11));
      eventSource = (EventSource *)local_279;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,(char *)this,(allocator *)eventSource);
      in_stack_fffffffffffffc10 = (Session *)binlog::Session::addEventSource(this,eventSource);
      local_1a0._M_i = (__int_type)in_stack_fffffffffffffc10;
      binlog::EventSource::~EventSource(in_stack_fffffffffffffbf0);
      std::allocator<char>::~allocator((allocator<char> *)local_279);
      std::allocator<char>::~allocator((allocator<char> *)&local_25c);
      std::allocator<char>::~allocator((allocator<char> *)&local_25b);
      std::allocator<char>::~allocator((allocator<char> *)&local_25a);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      local_28 = &main::_binlog_sid;
      local_30 = (Session *)local_1a0._M_i;
      local_34 = 5;
      in_stack_fffffffffffffc00 = &main::_binlog_sid;
      local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_40 = local_30;
      in_stack_fffffffffffffc0c = local_34;
      if (local_34 == 3) {
        ((SessionWriter *)in_stack_fffffffffffffc00)->_session = local_30;
      }
      else if (local_34 == 5) {
        LOCK();
        ((SessionWriter *)in_stack_fffffffffffffc00)->_session = local_30;
        UNLOCK();
      }
      else {
        ((SessionWriter *)in_stack_fffffffffffffc00)->_session = local_30;
      }
    }
    pSVar3 = binlog::default_thread_local_writer();
    t_1._M_i = local_1a0._M_i;
    in_stack_fffffffffffffbf0 = (EventSource *)binlog::clockNow();
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[20],std::pair<int,char>&,std::tuple<std::__cxx11::string,bool,int>&>
              ((SessionWriter *)in_stack_fffffffffffffc10,
               CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (uint64_t)in_stack_fffffffffffffc00,(char (*) [20])pSVar3,
               (pair<int,_char> *)in_stack_fffffffffffffbf0,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
                *)t_1._M_i);
  }
  binlog::consume<std::ostream>
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbf0);
  local_74 = 0;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
  ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
            *)0x103194);
  return local_74;
}

Assistant:

int main()
{
  std::tuple<> empty;
  BINLOG_INFO("Empty tuple: {}", empty);
  // Outputs: Empty tuple: ()

  //[stdtup
  std::pair<int, char> p{1, 'a'};
  std::tuple<std::string, bool, int> t{"foo", true, 2};
  BINLOG_INFO("Pair: {}, Tuple: {}", p, t);
  // Outputs: Pair: (1, a), Tuple: (foo, true, 2)
  //]

  binlog::consume(std::cout);
  return 0;
}